

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void ra_append(roaring_array_t *ra,uint16_t key,container_t *c,uint8_t typecode)

{
  int iVar1;
  
  extend_array(ra,1);
  iVar1 = ra->size;
  ra->keys[iVar1] = key;
  ra->containers[iVar1] = c;
  ra->typecodes[iVar1] = typecode;
  ra->size = ra->size + 1;
  return;
}

Assistant:

void ra_append(roaring_array_t *ra, uint16_t key, container_t *c,
               uint8_t typecode) {
    extend_array(ra, 1);
    const int32_t pos = ra->size;

    ra->keys[pos] = key;
    ra->containers[pos] = c;
    ra->typecodes[pos] = typecode;
    ra->size++;
}